

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_ThrowOutOfMemory(JSContext *ctx)

{
  JSRuntime *pJVar1;
  
  pJVar1 = ctx->rt;
  if (pJVar1->field_0xf0 == '\0') {
    pJVar1->field_0xf0 = 1;
    JS_ThrowInternalError(ctx,"out of memory");
    pJVar1->field_0xf0 = 0;
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

JSValue JS_ThrowOutOfMemory(JSContext *ctx)
{
    JSRuntime *rt = ctx->rt;
    if (!rt->in_out_of_memory) {
        rt->in_out_of_memory = TRUE;
        JS_ThrowInternalError(ctx, "out of memory");
        rt->in_out_of_memory = FALSE;
    }
    return JS_EXCEPTION;
}